

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-open.c
# Opt level: O3

int run_test_tcp_open_twice(void)

{
  uv_os_sock_t sock;
  uint uVar1;
  int iVar2;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  uint sock_00;
  int extraout_EAX_03;
  uv_loop_t *puVar3;
  uv_loop_t *puVar4;
  uv_timer_t *loop;
  undefined8 *extraout_RDX;
  undefined8 *extraout_RDX_00;
  code *tcp;
  uv_shutdown_t *loop_00;
  uv_write_t *puVar5;
  uv_handle_t *handle;
  uv_connect_t *loop_01;
  uv_tcp_t *puVar6;
  uv_tcp_t client;
  uv_buf_t uStack_398;
  uv_loop_t *puStack_388;
  sockaddr_in sStack_380;
  uv_loop_t *puStack_370;
  code *pcStack_368;
  code *pcStack_360;
  code *pcStack_358;
  code *pcStack_350;
  uv_buf_t uStack_340;
  undefined1 auStack_330 [16];
  undefined1 auStack_320 [264];
  sockaddr_in sStack_218;
  uv_tcp_t uStack_208;
  uv_loop_t *puStack_110;
  uv_tcp_t uStack_108;
  
  puStack_110 = (uv_loop_t *)0x170a41;
  sock = create_tcp_socket();
  puStack_110 = (uv_loop_t *)0x170a48;
  uVar1 = create_tcp_socket();
  puVar4 = (uv_loop_t *)(ulong)uVar1;
  puStack_110 = (uv_loop_t *)0x170a4f;
  puVar3 = uv_default_loop();
  puStack_110 = (uv_loop_t *)0x170a5a;
  iVar2 = uv_tcp_init(puVar3,&uStack_108);
  if (iVar2 == 0) {
    puStack_110 = (uv_loop_t *)0x170a6c;
    iVar2 = uv_tcp_open(&uStack_108,sock);
    if (iVar2 != 0) goto LAB_00170ae8;
    puStack_110 = (uv_loop_t *)0x170a7a;
    iVar2 = uv_tcp_open(&uStack_108,uVar1);
    if (iVar2 != -0x10) goto LAB_00170aed;
    puStack_110 = (uv_loop_t *)0x170a86;
    iVar2 = close(uVar1);
    if (iVar2 != 0) goto LAB_00170af2;
    puStack_110 = (uv_loop_t *)0x170a94;
    uv_close((uv_handle_t *)&uStack_108,(uv_close_cb)0x0);
    puStack_110 = (uv_loop_t *)0x170a99;
    puVar3 = uv_default_loop();
    puStack_110 = (uv_loop_t *)0x170aa3;
    uv_run(puVar3,UV_RUN_DEFAULT);
    puStack_110 = (uv_loop_t *)0x170aa8;
    puVar4 = uv_default_loop();
    puStack_110 = (uv_loop_t *)0x170abc;
    uv_walk(puVar4,close_walk_cb,(void *)0x0);
    puStack_110 = (uv_loop_t *)0x170ac6;
    uv_run(puVar4,UV_RUN_DEFAULT);
    puStack_110 = (uv_loop_t *)0x170acb;
    puVar3 = uv_default_loop();
    puStack_110 = (uv_loop_t *)0x170ad3;
    iVar2 = uv_loop_close(puVar3);
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    puStack_110 = (uv_loop_t *)0x170ae8;
    run_test_tcp_open_twice_cold_1();
LAB_00170ae8:
    puStack_110 = (uv_loop_t *)0x170aed;
    run_test_tcp_open_twice_cold_2();
LAB_00170aed:
    puStack_110 = (uv_loop_t *)0x170af2;
    run_test_tcp_open_twice_cold_3();
LAB_00170af2:
    puStack_110 = (uv_loop_t *)0x170af7;
    run_test_tcp_open_twice_cold_4();
  }
  puStack_110 = (uv_loop_t *)run_test_tcp_open_bound;
  run_test_tcp_open_twice_cold_5();
  auStack_320._248_8_ = (void *)0x170b09;
  puStack_110 = puVar4;
  uVar1 = create_tcp_socket();
  puVar3 = (uv_loop_t *)(ulong)uVar1;
  auStack_320._248_8_ = (void *)0x170b21;
  iVar2 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_218);
  if (iVar2 == 0) {
    auStack_320._248_8_ = (void *)0x170b2e;
    puVar4 = uv_default_loop();
    auStack_320._248_8_ = (void *)0x170b3b;
    iVar2 = uv_tcp_init(puVar4,&uStack_208);
    if (iVar2 != 0) goto LAB_00170bbd;
    auStack_320._248_8_ = (void *)0x170b50;
    iVar2 = bind(uVar1,(sockaddr *)&sStack_218,0x10);
    if (iVar2 != 0) goto LAB_00170bc2;
    auStack_320._248_8_ = (void *)0x170b60;
    iVar2 = uv_tcp_open(&uStack_208,uVar1);
    if (iVar2 != 0) goto LAB_00170bc7;
    auStack_320._248_8_ = (void *)0x170b75;
    iVar2 = uv_listen((uv_stream_t *)&uStack_208,0x80,(uv_connection_cb)0x0);
    if (iVar2 != 0) goto LAB_00170bcc;
    auStack_320._248_8_ = (void *)0x170b7e;
    puVar3 = uv_default_loop();
    auStack_320._248_8_ = (void *)0x170b92;
    uv_walk(puVar3,close_walk_cb,(void *)0x0);
    auStack_320._248_8_ = (void *)0x170b9c;
    uv_run(puVar3,UV_RUN_DEFAULT);
    auStack_320._248_8_ = (void *)0x170ba1;
    puVar4 = uv_default_loop();
    auStack_320._248_8_ = (void *)0x170ba9;
    iVar2 = uv_loop_close(puVar4);
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    auStack_320._248_8_ = (void *)0x170bbd;
    run_test_tcp_open_bound_cold_1();
LAB_00170bbd:
    auStack_320._248_8_ = (void *)0x170bc2;
    run_test_tcp_open_bound_cold_2();
LAB_00170bc2:
    auStack_320._248_8_ = (void *)0x170bc7;
    run_test_tcp_open_bound_cold_3();
LAB_00170bc7:
    auStack_320._248_8_ = (void *)0x170bcc;
    run_test_tcp_open_bound_cold_4();
LAB_00170bcc:
    auStack_320._248_8_ = (void *)0x170bd1;
    run_test_tcp_open_bound_cold_5();
  }
  auStack_320._248_8_ = run_test_tcp_open_connected;
  run_test_tcp_open_bound_cold_6();
  pcStack_350 = (code *)0x170bef;
  auStack_320._248_8_ = puVar3;
  uStack_340 = uv_buf_init("PING",4);
  loop_00 = (uv_shutdown_t *)0x1a4b3a;
  tcp = (code *)0x23a3;
  pcStack_350 = (code *)0x170c0f;
  iVar2 = uv_ip4_addr("127.0.0.1",0x23a3,(sockaddr_in *)auStack_330);
  if (iVar2 == 0) {
    pcStack_350 = (code *)0x170c1c;
    uVar1 = create_tcp_socket();
    puVar3 = (uv_loop_t *)(ulong)uVar1;
    tcp = (code *)auStack_330;
    loop_00 = (uv_shutdown_t *)(ulong)uVar1;
    pcStack_350 = (code *)0x170c2f;
    iVar2 = connect(uVar1,(sockaddr *)tcp,0x10);
    if (iVar2 != 0) goto LAB_00170d3d;
    pcStack_350 = (code *)0x170c3c;
    loop_00 = (uv_shutdown_t *)uv_default_loop();
    tcp = (code *)auStack_320;
    pcStack_350 = (code *)0x170c49;
    iVar2 = uv_tcp_init((uv_loop_t *)loop_00,(uv_tcp_t *)tcp);
    if (iVar2 != 0) goto LAB_00170d42;
    loop_00 = (uv_shutdown_t *)auStack_320;
    tcp = (code *)(ulong)uVar1;
    pcStack_350 = (code *)0x170c5d;
    iVar2 = uv_tcp_open((uv_tcp_t *)loop_00,uVar1);
    if (iVar2 != 0) goto LAB_00170d47;
    puVar5 = &write_req;
    tcp = (code *)auStack_320;
    pcStack_350 = (code *)0x170c87;
    iVar2 = uv_write(&write_req,(uv_stream_t *)tcp,&uStack_340,1,write_cb);
    loop_00 = (uv_shutdown_t *)puVar5;
    if (iVar2 != 0) goto LAB_00170d4c;
    loop_00 = &shutdown_req;
    tcp = (code *)auStack_320;
    pcStack_350 = (code *)0x170ca7;
    iVar2 = uv_shutdown(&shutdown_req,(uv_stream_t *)tcp,shutdown_cb);
    if (iVar2 != 0) goto LAB_00170d51;
    tcp = alloc_cb;
    loop_00 = (uv_shutdown_t *)auStack_320;
    pcStack_350 = (code *)0x170cc7;
    iVar2 = uv_read_start((uv_stream_t *)loop_00,alloc_cb,read_cb);
    if (iVar2 != 0) goto LAB_00170d56;
    pcStack_350 = (code *)0x170cd4;
    loop_00 = (uv_shutdown_t *)uv_default_loop();
    tcp = (code *)0x0;
    pcStack_350 = (code *)0x170cde;
    uv_run((uv_loop_t *)loop_00,UV_RUN_DEFAULT);
    if (shutdown_cb_called != 1) goto LAB_00170d5b;
    if (write_cb_called != 1) goto LAB_00170d60;
    if (close_cb_called != 1) goto LAB_00170d65;
    pcStack_350 = (code *)0x170cfe;
    puVar3 = uv_default_loop();
    pcStack_350 = (code *)0x170d12;
    uv_walk(puVar3,close_walk_cb,(void *)0x0);
    tcp = (code *)0x0;
    pcStack_350 = (code *)0x170d1c;
    uv_run(puVar3,UV_RUN_DEFAULT);
    pcStack_350 = (code *)0x170d21;
    loop_00 = (uv_shutdown_t *)uv_default_loop();
    pcStack_350 = (code *)0x170d29;
    iVar2 = uv_loop_close((uv_loop_t *)loop_00);
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    pcStack_350 = (code *)0x170d3d;
    run_test_tcp_open_connected_cold_1();
LAB_00170d3d:
    pcStack_350 = (code *)0x170d42;
    run_test_tcp_open_connected_cold_2();
LAB_00170d42:
    pcStack_350 = (code *)0x170d47;
    run_test_tcp_open_connected_cold_3();
LAB_00170d47:
    pcStack_350 = (code *)0x170d4c;
    run_test_tcp_open_connected_cold_4();
LAB_00170d4c:
    pcStack_350 = (code *)0x170d51;
    run_test_tcp_open_connected_cold_5();
LAB_00170d51:
    pcStack_350 = (code *)0x170d56;
    run_test_tcp_open_connected_cold_6();
LAB_00170d56:
    pcStack_350 = (code *)0x170d5b;
    run_test_tcp_open_connected_cold_7();
LAB_00170d5b:
    pcStack_350 = (code *)0x170d60;
    run_test_tcp_open_connected_cold_8();
LAB_00170d60:
    pcStack_350 = (code *)0x170d65;
    run_test_tcp_open_connected_cold_9();
LAB_00170d65:
    pcStack_350 = (code *)0x170d6a;
    run_test_tcp_open_connected_cold_10();
  }
  pcStack_350 = write_cb;
  run_test_tcp_open_connected_cold_11();
  if ((uv_loop_t *)loop_00 == (uv_loop_t *)0x0) {
    pcStack_358 = (code *)0x170d86;
    write_cb_cold_2();
  }
  else if ((int)tcp == 0) {
    write_cb_called = write_cb_called + 1;
    return extraout_EAX;
  }
  handle = (uv_handle_t *)((ulong)tcp & 0xffffffff);
  pcStack_358 = shutdown_cb;
  write_cb_cold_1();
  if (handle == (uv_handle_t *)&shutdown_req) {
    if ((int)tcp == 0) {
      shutdown_cb_called = shutdown_cb_called + 1;
      return extraout_EAX_00;
    }
  }
  else {
    pcStack_360 = (code *)0x170dab;
    shutdown_cb_cold_1();
  }
  pcStack_360 = alloc_cb;
  shutdown_cb_cold_2();
  if (tcp < (uv_tcp_t *)0x10001) {
    *extraout_RDX = alloc_cb::slab;
    extraout_RDX[1] = 0x10000;
    return 0x3378a0;
  }
  pcStack_368 = read_cb;
  alloc_cb_cold_1();
  if (handle == (uv_handle_t *)0x0) {
    puStack_370 = (uv_loop_t *)0x170e0b;
    read_cb_cold_4();
LAB_00170e0b:
    puStack_370 = (uv_loop_t *)0x170e10;
    read_cb_cold_2();
LAB_00170e10:
    puStack_370 = (uv_loop_t *)0x170e15;
    read_cb_cold_3();
  }
  else {
    if (-1 < (long)tcp) {
      if ((uv_tcp_t *)tcp != (uv_tcp_t *)0x4) goto LAB_00170e0b;
      if (*(int *)*extraout_RDX_00 == 0x474e4950) {
        return extraout_EAX_01;
      }
      goto LAB_00170e10;
    }
    if ((uv_tcp_t *)tcp == (uv_tcp_t *)0xfffffffffffff001) {
      uv_close(handle,close_cb);
      return extraout_EAX_02;
    }
  }
  puStack_370 = (uv_loop_t *)run_test_tcp_write_ready;
  read_cb_cold_1();
  loop_01 = (uv_connect_t *)0x1a4b3a;
  uVar1 = 0x23a3;
  puStack_388 = (uv_loop_t *)0x170e33;
  puStack_370 = puVar3;
  iVar2 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_380);
  if (iVar2 == 0) {
    puStack_388 = (uv_loop_t *)0x170e40;
    sock_00 = create_tcp_socket();
    puVar3 = (uv_loop_t *)(ulong)sock_00;
    puStack_388 = (uv_loop_t *)0x170e47;
    loop_01 = (uv_connect_t *)uv_default_loop();
    uVar1 = 0x337620;
    puStack_388 = (uv_loop_t *)0x170e56;
    iVar2 = uv_tcp_init((uv_loop_t *)loop_01,&::client);
    if (iVar2 != 0) goto LAB_00170f16;
    puVar6 = &::client;
    puStack_388 = (uv_loop_t *)0x170e6c;
    iVar2 = uv_tcp_open(&::client,sock_00);
    loop_01 = (uv_connect_t *)puVar6;
    if (iVar2 != 0) goto LAB_00170f1b;
    loop_01 = &connect_req;
    sock_00 = 0x337620;
    puStack_388 = (uv_loop_t *)0x170e91;
    iVar2 = uv_tcp_connect(&connect_req,&::client,(sockaddr *)&sStack_380,connect1_cb);
    if (iVar2 != 0) goto LAB_00170f20;
    puStack_388 = (uv_loop_t *)0x170e9e;
    loop_01 = (uv_connect_t *)uv_default_loop();
    sock_00 = 0;
    puStack_388 = (uv_loop_t *)0x170ea8;
    uv_run((uv_loop_t *)loop_01,UV_RUN_DEFAULT);
    if (shutdown_cb_called != 1) goto LAB_00170f25;
    if (shutdown_requested != 1) goto LAB_00170f2a;
    if (connect_cb_called != 1) goto LAB_00170f2f;
    if (write_cb_called < 1) goto LAB_00170f34;
    if (close_cb_called != 1) goto LAB_00170f39;
    puStack_388 = (uv_loop_t *)0x170eda;
    puVar3 = uv_default_loop();
    puStack_388 = (uv_loop_t *)0x170eee;
    uv_walk(puVar3,close_walk_cb,(void *)0x0);
    sock_00 = 0;
    puStack_388 = (uv_loop_t *)0x170ef8;
    uv_run(puVar3,UV_RUN_DEFAULT);
    puStack_388 = (uv_loop_t *)0x170efd;
    loop_01 = (uv_connect_t *)uv_default_loop();
    puStack_388 = (uv_loop_t *)0x170f05;
    iVar2 = uv_loop_close((uv_loop_t *)loop_01);
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    puStack_388 = (uv_loop_t *)0x170f16;
    run_test_tcp_write_ready_cold_1();
LAB_00170f16:
    sock_00 = uVar1;
    puStack_388 = (uv_loop_t *)0x170f1b;
    run_test_tcp_write_ready_cold_2();
LAB_00170f1b:
    puStack_388 = (uv_loop_t *)0x170f20;
    run_test_tcp_write_ready_cold_3();
LAB_00170f20:
    puStack_388 = (uv_loop_t *)0x170f25;
    run_test_tcp_write_ready_cold_4();
LAB_00170f25:
    puStack_388 = (uv_loop_t *)0x170f2a;
    run_test_tcp_write_ready_cold_5();
LAB_00170f2a:
    puStack_388 = (uv_loop_t *)0x170f2f;
    run_test_tcp_write_ready_cold_6();
LAB_00170f2f:
    puStack_388 = (uv_loop_t *)0x170f34;
    run_test_tcp_write_ready_cold_7();
LAB_00170f34:
    puStack_388 = (uv_loop_t *)0x170f39;
    run_test_tcp_write_ready_cold_8();
LAB_00170f39:
    puStack_388 = (uv_loop_t *)0x170f3e;
    run_test_tcp_write_ready_cold_9();
  }
  puStack_388 = (uv_loop_t *)connect1_cb;
  run_test_tcp_write_ready_cold_10();
  puVar4 = (uv_loop_t *)connect_req.handle;
  puStack_388 = puVar3;
  if (loop_01 == &connect_req) {
    loop = (uv_timer_t *)loop_01;
    if (sock_00 != 0) goto LAB_00171009;
    connect_cb_called = connect_cb_called + 1;
    loop = (uv_timer_t *)uv_default_loop();
    iVar2 = uv_timer_init((uv_loop_t *)loop,&tm);
    if (iVar2 != 0) goto LAB_0017100e;
    loop = &tm;
    iVar2 = uv_timer_start(&tm,timer_cb,2000,0);
    if (iVar2 != 0) goto LAB_00171013;
    uStack_398 = uv_buf_init("P",1);
    puVar5 = &write_req;
    iVar2 = uv_write(&write_req,(uv_stream_t *)puVar4,&uStack_398,1,write1_cb);
    loop = (uv_timer_t *)puVar5;
    if (iVar2 == 0) {
      iVar2 = uv_read_start((uv_stream_t *)puVar4,alloc_cb,read1_cb);
      if (iVar2 == 0) {
        return 0;
      }
      goto LAB_0017101d;
    }
  }
  else {
    connect1_cb_cold_1();
    loop = (uv_timer_t *)loop_01;
LAB_00171009:
    connect1_cb_cold_2();
LAB_0017100e:
    connect1_cb_cold_3();
LAB_00171013:
    connect1_cb_cold_4();
  }
  puVar4 = (uv_loop_t *)loop;
  connect1_cb_cold_5();
LAB_0017101d:
  connect1_cb_cold_6();
  iVar2 = uv_is_closing((uv_handle_t *)puVar4);
  if (iVar2 != 0) {
    return iVar2;
  }
  uv_close((uv_handle_t *)puVar4,(uv_close_cb)0x0);
  return extraout_EAX_03;
}

Assistant:

TEST_IMPL(tcp_open_twice) {
  uv_tcp_t client;
  uv_os_sock_t sock1, sock2;
  int r;

  startup();
  sock1 = create_tcp_socket();
  sock2 = create_tcp_socket();

  r = uv_tcp_init(uv_default_loop(), &client);
  ASSERT(r == 0);

  r = uv_tcp_open(&client, sock1);
  ASSERT(r == 0);

  r = uv_tcp_open(&client, sock2);
  ASSERT(r == UV_EBUSY);
  close_socket(sock2);

  uv_close((uv_handle_t*) &client, NULL);
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  MAKE_VALGRIND_HAPPY();
  return 0;
}